

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperRefs.c
# Opt level: O2

float Map_NodeReadRefPhaseEst(Map_Node_t *pNode,int fPhase)

{
  uint __line;
  float *pfVar1;
  char *__assertion;
  
  if (((ulong)pNode & 1) != 0) {
    __assertion = "!Map_IsComplement(pNode)";
    __line = 0x41;
LAB_0036b3ce:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mapper/mapperRefs.c"
                  ,__line,"float Map_NodeReadRefPhaseEst(Map_Node_t *, int)");
  }
  if (pNode->pCutBest[0] == (Map_Cut_t *)0x0) {
    if (pNode->pCutBest[1] == (Map_Cut_t *)0x0) {
      __assertion = "pNode->pCutBest[0] || pNode->pCutBest[1]";
      __line = 0x44;
      goto LAB_0036b3ce;
    }
  }
  else if (pNode->pCutBest[1] != (Map_Cut_t *)0x0) {
    pfVar1 = pNode->nRefEst + fPhase;
    goto LAB_0036b398;
  }
  pfVar1 = pNode->nRefEst + 2;
LAB_0036b398:
  return *pfVar1;
}

Assistant:

float Map_NodeReadRefPhaseEst( Map_Node_t * pNode, int fPhase )
{
    assert( !Map_IsComplement(pNode) );
    if ( pNode->pCutBest[0] && pNode->pCutBest[1] ) // both assigned
        return pNode->nRefEst[fPhase];
    assert( pNode->pCutBest[0] || pNode->pCutBest[1] ); // at least one assigned
//    return pNode->nRefEst[0] + pNode->nRefEst[1];
    return pNode->nRefEst[2];
}